

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void GCTM(lua_State *L,int propagateerrors)

{
  unsigned_short *puVar1;
  byte bVar2;
  lu_byte lVar3;
  lu_byte lVar4;
  global_State *pgVar5;
  StkId pTVar6;
  undefined4 uVar7;
  int iVar8;
  TValue *pTVar9;
  char *pcVar10;
  TValue v;
  Value local_38;
  uint uStack_30;
  undefined4 uStack_2c;
  
  pgVar5 = L->l_G;
  local_38 = (Value)pgVar5->tobefnz;
  pgVar5->tobefnz = (local_38.gc)->next;
  (local_38.gc)->next = pgVar5->allgc;
  pgVar5->allgc = (GCObject *)local_38;
  bVar2 = (local_38.gc)->marked;
  (local_38.gc)->marked = bVar2 & 0xf7;
  if ((byte)(pgVar5->gcstate - 2) < 4) {
    (local_38.gc)->marked = pgVar5->currentwhite & 3 | bVar2 & 0xf0;
  }
  uStack_30 = (local_38.gc)->tt | 0x40;
  pTVar9 = luaT_gettmbyobj(L,(TValue *)&local_38,TM_GC);
  if ((pTVar9 != (TValue *)0x0) && ((pTVar9->tt_ & 0xfU) == 6)) {
    lVar3 = L->allowhook;
    lVar4 = pgVar5->gcrunning;
    L->allowhook = '\0';
    pgVar5->gcrunning = '\0';
    pTVar6 = L->top;
    iVar8 = pTVar9->tt_;
    uVar7 = *(undefined4 *)&pTVar9->field_0xc;
    pTVar6->value_ = pTVar9->value_;
    pTVar6->tt_ = iVar8;
    *(undefined4 *)&pTVar6->field_0xc = uVar7;
    pTVar6 = L->top;
    pTVar6[1].value_.gc = (GCObject *)local_38;
    *(ulong *)&pTVar6[1].tt_ = CONCAT44(uStack_2c,uStack_30);
    pTVar6 = L->top;
    L->top = pTVar6 + 2;
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 | 0x100;
    iVar8 = luaD_pcall(L,dothecall,(void *)0x0,(long)pTVar6 - (long)L->stack,0);
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 & 0xfeff;
    L->allowhook = lVar3;
    pgVar5->gcrunning = lVar4;
    if ((propagateerrors != 0) && (iVar8 != 0)) {
      if (iVar8 == 2) {
        if ((L->top[-1].tt_ & 0xfU) == 4) {
          pcVar10 = (char *)(L->top[-1].value_.f + 0x18);
        }
        else {
          pcVar10 = "no message";
        }
        luaO_pushfstring(L,"error in __gc metamethod (%s)",pcVar10);
        iVar8 = 5;
      }
      luaD_throw(L,iVar8);
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L, int propagateerrors) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (tm != NULL && ttisfunction(tm)) {  /* is there a finalizer? */
    int status;
    lu_byte oldah = L->allowhook;
    int running  = g->gcrunning;
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    g->gcrunning = 0;  /* avoid GC steps */
    setobj2s(L, L->top, tm);  /* push finalizer... */
    setobj2s(L, L->top + 1, &v);  /* ... and its argument */
    L->top += 2;  /* and (next line) call the finalizer */
    L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top - 2), 0);
    L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
    L->allowhook = oldah;  /* restore hooks */
    g->gcrunning = running;  /* restore state */
    if (status != LUA_OK && propagateerrors) {  /* error while running __gc? */
      if (status == LUA_ERRRUN) {  /* is there an error object? */
        const char *msg = (ttisstring(L->top - 1))
                            ? svalue(L->top - 1)
                            : "no message";
        luaO_pushfstring(L, "error in __gc metamethod (%s)", msg);
        status = LUA_ERRGCMM;  /* error in __gc metamethod */
      }
      luaD_throw(L, status);  /* re-throw error */
    }
  }
}